

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::SetStackNestedFuncParent(FunctionBody *this,FunctionInfo *parentFunctionInfo)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *this_00;
  RecyclerWeakReference<Js::FunctionInfo> *pRVar3;
  FunctionInfo *pFVar4;
  undefined4 *puVar5;
  ScriptContext *this_01;
  Recycler *this_02;
  RecyclerWeakReference<Js::FunctionInfo> *parent;
  FunctionBody *parentFunctionBody;
  FunctionInfo *parentFunctionInfo_local;
  FunctionBody *this_local;
  
  this_00 = FunctionInfo::GetFunctionBody(parentFunctionInfo);
  pRVar3 = GetStackNestedFuncParent(this);
  if (pRVar3 == (RecyclerWeakReference<Js::FunctionInfo> *)0x0) {
    bVar2 = ParseableFunctionInfo::DoStackNestedFunc(&this_00->super_ParseableFunctionInfo);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x105b,"(parentFunctionBody->DoStackNestedFunc())",
                                  "parentFunctionBody->DoStackNestedFunc()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_01 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
    this_02 = ScriptContext::GetRecycler(this_01);
    pRVar3 = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionInfo>
                       (this_02,parentFunctionInfo);
    FunctionProxy::
    SetAuxPtr<(Js::FunctionProxy::AuxPointerType)5,Memory::RecyclerWeakReference<Js::FunctionInfo>*>
              ((FunctionProxy *)this,pRVar3);
  }
  else {
    pFVar4 = Memory::RecyclerWeakReference<Js::FunctionInfo>::Get(pRVar3);
    if (pFVar4 != parentFunctionInfo) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1054,"(parent->Get() == parentFunctionInfo)",
                                  "parent->Get() == parentFunctionInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void FunctionBody::SetStackNestedFuncParent(FunctionInfo * parentFunctionInfo)
    {
        FunctionBody * parentFunctionBody = parentFunctionInfo->GetFunctionBody();
        RecyclerWeakReference<FunctionInfo>* parent = this->GetStackNestedFuncParent();
        if (parent != nullptr)
        {
            Assert(parent->Get() == parentFunctionInfo);
            return;
        }
//      Redeferral invalidates this assertion, as we may be recompiling with a different view of nested functions and
//      thus making different stack-nested-function decisions. I'm inclined to allow this, since things that have been
//      re-deferred will likely not be executed again, so it makes sense to exclude them from our analysis.
//        Assert(CanDoStackNestedFunc());
        Assert(parentFunctionBody->DoStackNestedFunc());

        this->SetAuxPtr<AuxPointerType::StackNestedFuncParent>(this->GetScriptContext()->GetRecycler()->CreateWeakReferenceHandle(parentFunctionInfo));
    }